

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aws_command_runner_test.cc
# Opt level: O2

void __thiscall AwsCommandRunner_Finished_Test::TestBody(AwsCommandRunner_Finished_Test *this)

{
  bool bVar1;
  MockSpec<bool_()> *pMVar2;
  TypedExpectation<bool_()> *pTVar3;
  char *in_R9;
  AssertHelper AStack_288;
  allocator local_279;
  string local_278;
  undefined1 local_258 [8];
  linked_ptr_internal lStack_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  _Base_ptr local_238;
  size_t local_230;
  AssertionResult gtest_ar_;
  AwsCommandRunner aws_command_runner;
  MultipleCommandRunner multiple_command_runner;
  MockCommandRunner command_runner;
  
  anon_unknown.dwarf_103e0::MockCommandRunner::MockCommandRunner(&command_runner);
  MultipleCommandRunner::MultipleCommandRunner
            (&multiple_command_runner,&command_runner.super_CommandRunner);
  pMVar2 = anon_unknown.dwarf_103e0::MockCommandRunner::gmock_Finished(&command_runner);
  pTVar3 = testing::internal::MockSpec<bool_()>::InternalExpectedAt
                     (pMVar2,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/aws_command_runner_test.cc"
                      ,0x1b,"command_runner","Finished()");
  pTVar3 = testing::internal::TypedExpectation<bool_()>::Times(pTVar3,2);
  local_258 = (undefined1  [8])operator_new(1);
  *(bool *)local_258 = false;
  lStack_250.next_ = &lStack_250;
  testing::internal::ReturnAction::operator_cast_to_Action((ReturnAction *)&aws_command_runner);
  pTVar3 = testing::internal::TypedExpectation<bool_()>::WillOnce
                     (pTVar3,(Action<bool_()> *)&aws_command_runner);
  local_278._M_dataplus._M_p = (pointer)operator_new(1);
  *local_278._M_dataplus._M_p = '\x01';
  local_278._M_string_length = (size_type)&local_278._M_string_length;
  testing::internal::ReturnAction::operator_cast_to_Action((ReturnAction *)&gtest_ar_);
  testing::internal::TypedExpectation<bool_()>::WillOnce(pTVar3,(Action<bool_()> *)&gtest_ar_);
  testing::internal::linked_ptr<testing::ActionInterface<bool_()>_>::~linked_ptr
            ((linked_ptr<testing::ActionInterface<bool_()>_> *)&gtest_ar_);
  testing::internal::linked_ptr<bool>::~linked_ptr((linked_ptr<bool> *)&local_278);
  testing::internal::linked_ptr<testing::ActionInterface<bool_()>_>::~linked_ptr
            ((linked_ptr<testing::ActionInterface<bool_()>_> *)&aws_command_runner);
  testing::internal::linked_ptr<bool>::~linked_ptr((linked_ptr<bool> *)local_258);
  pMVar2 = anon_unknown.dwarf_103e0::MockCommandRunner::gmock_PreviousCommandFailed(&command_runner)
  ;
  pTVar3 = testing::internal::MockSpec<bool_()>::InternalExpectedAt
                     (pMVar2,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/aws_command_runner_test.cc"
                      ,0x1f,"command_runner","PreviousCommandFailed()");
  local_258 = (undefined1  [8])operator_new(1);
  *(bool *)local_258 = false;
  lStack_250.next_ = &lStack_250;
  testing::internal::ReturnAction::operator_cast_to_Action((ReturnAction *)&aws_command_runner);
  testing::internal::TypedExpectation<bool_()>::WillRepeatedly
            (pTVar3,(Action<bool_()> *)&aws_command_runner);
  testing::internal::linked_ptr<testing::ActionInterface<bool_()>_>::~linked_ptr
            ((linked_ptr<testing::ActionInterface<bool_()>_> *)&aws_command_runner);
  testing::internal::linked_ptr<bool>::~linked_ptr((linked_ptr<bool> *)local_258);
  std::__cxx11::string::string((string *)&gtest_ar_,"/tmp/",(allocator *)&AStack_288);
  std::__cxx11::string::string((string *)&local_278,"unused",&local_279);
  local_258 = (undefined1  [8])0x0;
  lStack_250.next_ = (linked_ptr_internal *)0x0;
  local_248._M_allocated_capacity = 0;
  local_230 = 0;
  local_248._8_8_ = (_Base_ptr)&lStack_250;
  local_238 = (_Base_ptr)&lStack_250;
  AwsCommandRunner::AwsCommandRunner
            (&aws_command_runner,&multiple_command_runner,(string *)&gtest_ar_,&local_278,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_258);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_258);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&gtest_ar_);
  bVar1 = AwsCommandRunner::Finished(&aws_command_runner);
  gtest_ar_.success_ = !bVar1;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (bVar1) {
    testing::Message::Message((Message *)&local_278);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_258,(internal *)&gtest_ar_,
               (AssertionResult *)"aws_command_runner.Finished()","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_288,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/aws_command_runner_test.cc"
               ,0x24,(char *)local_258);
    testing::internal::AssertHelper::operator=(&AStack_288,(Message *)&local_278);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar_.message_);
    gtest_ar_.success_ = AwsCommandRunner::Finished(&aws_command_runner);
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (gtest_ar_.success_) goto LAB_00158b0c;
    testing::Message::Message((Message *)&local_278);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_258,(internal *)&gtest_ar_,
               (AssertionResult *)"aws_command_runner.Finished()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_288,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/aws_command_runner_test.cc"
               ,0x25,(char *)local_258);
    testing::internal::AssertHelper::operator=(&AStack_288,(Message *)&local_278);
  }
  testing::internal::AssertHelper::~AssertHelper(&AStack_288);
  std::__cxx11::string::~string((string *)local_258);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_278);
LAB_00158b0c:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  AwsCommandRunner::~AwsCommandRunner(&aws_command_runner);
  std::
  deque<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>,_std::allocator<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>_>_>
  ::~deque(&multiple_command_runner.enqueued_commands_.c);
  anon_unknown.dwarf_103e0::MockCommandRunner::~MockCommandRunner(&command_runner);
  return;
}

Assistant:

TEST(AwsCommandRunner, Finished) {
  MockCommandRunner command_runner;
  MultipleCommandRunner multiple_command_runner(&command_runner);
  EXPECT_CALL(command_runner, Finished())
      .Times(2)
      .WillOnce(Return(false))
      .WillOnce(Return(true));
  EXPECT_CALL(command_runner, PreviousCommandFailed())
      .WillRepeatedly(Return(false));

  AwsCommandRunner aws_command_runner(&multiple_command_runner, "/tmp/",
                                      "unused", {});
  ASSERT_FALSE(aws_command_runner.Finished());
  ASSERT_TRUE(aws_command_runner.Finished());
}